

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::anon_unknown_6::LineBufferTask::execute(LineBufferTask_conflict1 *this)

{
  long *plVar1;
  long lVar2;
  value_type pIVar3;
  undefined4 uVar4;
  int iVar5;
  int *piVar6;
  reference pvVar7;
  Compressor *pCVar8;
  size_type sVar9;
  reference ppIVar10;
  long in_RDI;
  exception *e;
  int width;
  InSliceInfo_conflict *slice;
  uint i_2;
  char *readPtr;
  int y;
  int dy;
  int yStop;
  int yStart;
  int i_1;
  Int64 maxBytesPerLine;
  int i;
  int maxY;
  Int64 uncompressedSize;
  double in_stack_00000200;
  undefined1 in_stack_0000020b;
  int in_stack_0000020c;
  ptrdiff_t in_stack_00000210;
  ptrdiff_t in_stack_00000218;
  char *in_stack_00000220;
  char *in_stack_00000228;
  char **in_stack_00000230;
  int in_stack_00000240;
  int in_stack_00000248;
  int in_stack_00000250;
  int in_stack_00000258;
  int in_stack_00000260;
  int in_stack_00000268;
  ptrdiff_t in_stack_00000270;
  ptrdiff_t in_stack_00000278;
  ptrdiff_t in_stack_00000280;
  Format in_stack_00000290;
  PixelType in_stack_00000298;
  PixelType in_stack_000002a0;
  int in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  size_t in_stack_fffffffffffffec8;
  char **in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  size_t in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  Compression c;
  uint local_7c;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_4c;
  ulong local_48;
  int local_40;
  ulong local_38;
  
  if (**(long **)(in_RDI + 0x18) == 0) {
    local_38 = 0;
    piVar6 = std::min<int>((int *)(*(long *)(in_RDI + 0x18) + 0x24),
                           (int *)(*(long *)(in_RDI + 0x10) + 0xe0));
    iVar5 = *piVar6;
    for (local_40 = *(int *)(*(long *)(in_RDI + 0x18) + 0x20) -
                    *(int *)(*(long *)(in_RDI + 0x10) + 0xdc);
        local_40 <= iVar5 - *(int *)(*(long *)(in_RDI + 0x10) + 0xdc); local_40 = local_40 + 1) {
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          (*(long *)(in_RDI + 0x10) + 0x108),(long)local_40);
      local_38 = (long)(int)*pvVar7 + local_38;
    }
    if ((*(long *)(*(long *)(in_RDI + 0x18) + 0x28) != 0) &&
       (plVar1 = *(long **)(*(long *)(in_RDI + 0x18) + 0x28), plVar1 != (long *)0x0)) {
      (**(code **)(*plVar1 + 8))();
    }
    local_48 = 0;
    for (local_4c = *(int *)(*(long *)(in_RDI + 0x18) + 0x20) -
                    *(int *)(*(long *)(in_RDI + 0x10) + 0xdc);
        c = (Compression)((ulong)in_stack_ffffffffffffff08 >> 0x20),
        local_4c <= iVar5 - *(int *)(*(long *)(in_RDI + 0x10) + 0xdc); local_4c = local_4c + 1) {
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          (*(long *)(in_RDI + 0x10) + 0x108),(long)local_4c);
      if (local_48 < *pvVar7) {
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            (*(long *)(in_RDI + 0x10) + 0x108),(long)local_4c);
        local_48 = *pvVar7;
      }
    }
    Header::compression((Header *)0x80006c);
    pCVar8 = newCompressor(c,in_stack_ffffffffffffff00,
                           (Header *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    *(Compressor **)(*(long *)(in_RDI + 0x18) + 0x28) = pCVar8;
    if ((*(long *)(*(long *)(in_RDI + 0x18) + 0x28) == 0) ||
       (local_38 <= *(ulong *)(*(long *)(in_RDI + 0x18) + 0x10))) {
      *(undefined4 *)(*(long *)(in_RDI + 0x18) + 0x30) = 1;
      **(undefined8 **)(in_RDI + 0x18) = *(undefined8 *)(*(long *)(in_RDI + 0x18) + 8);
    }
    else {
      uVar4 = (**(code **)(**(long **)(*(long *)(in_RDI + 0x18) + 0x28) + 0x18))();
      *(undefined4 *)(*(long *)(in_RDI + 0x18) + 0x30) = uVar4;
      lVar2 = *(long *)(in_RDI + 0x18);
      iVar5 = (**(code **)(**(long **)(lVar2 + 0x28) + 0x30))
                        (*(long **)(lVar2 + 0x28),*(undefined8 *)(lVar2 + 8),
                         *(undefined4 *)(lVar2 + 0x10),*(undefined4 *)(lVar2 + 0x20));
      *(long *)(*(long *)(in_RDI + 0x18) + 0x10) = (long)iVar5;
    }
  }
  if (*(int *)(*(long *)(in_RDI + 0x10) + 0xd0) == 0) {
    local_60 = *(int *)(in_RDI + 0x20);
    local_64 = *(int *)(in_RDI + 0x24) + 1;
    local_68 = 1;
  }
  else {
    local_60 = *(int *)(in_RDI + 0x24);
    local_64 = *(int *)(in_RDI + 0x20) + -1;
    local_68 = -1;
  }
  for (local_6c = local_60; local_6c != local_64; local_6c = local_68 + local_6c) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               (*(long *)(in_RDI + 0x10) + 0x120),
               (long)(local_6c - *(int *)(*(long *)(in_RDI + 0x10) + 0xdc)));
    for (local_7c = 0;
        sVar9 = std::
                vector<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
                ::size((vector<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
                        *)(*(long *)(in_RDI + 0x10) + 0x138)), local_7c < sVar9;
        local_7c = local_7c + 1) {
      ppIVar10 = std::
                 vector<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
                 ::operator[]((vector<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
                               *)(*(long *)(in_RDI + 0x10) + 0x138),(ulong)local_7c);
      pIVar3 = *ppIVar10;
      iVar5 = Imath_2_5::modp(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0);
      if (iVar5 == 0) {
        if ((pIVar3->skip & 1U) == 0) {
          Array2D<unsigned_int>::operator[]
                    ((Array2D<unsigned_int> *)(*(long *)(in_RDI + 0x10) + 0x188),0);
          in_stack_fffffffffffffea0 = *(int *)(*(long *)(in_RDI + 0x10) + 0xd8);
          in_stack_fffffffffffffec8 = pIVar3->sampleStride;
          in_stack_fffffffffffffed0 = (char **)pIVar3->xPointerStride;
          in_stack_fffffffffffffec0 = 0;
          copyIntoDeepFrameBuffer
                    (in_stack_00000230,in_stack_00000228,in_stack_00000220,in_stack_00000218,
                     in_stack_00000210,in_stack_0000020c,in_stack_00000240,in_stack_00000248,
                     in_stack_00000250,in_stack_00000258,in_stack_00000260,in_stack_00000268,
                     in_stack_00000270,in_stack_00000278,in_stack_00000280,(bool)in_stack_0000020b,
                     in_stack_00000200,in_stack_00000290,in_stack_00000298,in_stack_000002a0);
        }
        else {
          Array::operator_cast_to_unsigned_int_((Array *)(*(long *)(in_RDI + 0x10) + 0x1a0));
          skipChannel(in_stack_fffffffffffffed0,(PixelType)(in_stack_fffffffffffffec8 >> 0x20),
                      CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        }
      }
    }
  }
  return;
}

Assistant:

void
LineBufferTask::execute ()
{
    try
    {
        //
        // Uncompress the data, if necessary
        //

        if (_lineBuffer->uncompressedData == 0)
        {
            Int64 uncompressedSize = 0;
            int maxY = min (_lineBuffer->maxY, _ifd->maxY);

            for (int i = _lineBuffer->minY - _ifd->minY;
                 i <= maxY - _ifd->minY;
                 ++i)
            {
                uncompressedSize += (int) _ifd->bytesPerLine[i];
            }

            //
            // Create the compressor everytime when we want to use it,
            // because we don't know maxBytesPerLine beforehand.
            // (TODO) optimize this. don't do this every time.
            //

            if (_lineBuffer->compressor != 0)
                delete _lineBuffer->compressor;
            Int64 maxBytesPerLine = 0;
            for (int i = _lineBuffer->minY - _ifd->minY;
                 i <= maxY - _ifd->minY;
                 ++i)
            {
                if (_ifd->bytesPerLine[i] > maxBytesPerLine)
                    maxBytesPerLine = _ifd->bytesPerLine[i];
            }
            _lineBuffer->compressor = newCompressor(_ifd->header.compression(),
                                                    maxBytesPerLine,
                                                    _ifd->header);

            if (_lineBuffer->compressor &&
                _lineBuffer->packedDataSize < uncompressedSize)
            {
                _lineBuffer->format = _lineBuffer->compressor->format();

                _lineBuffer->packedDataSize = _lineBuffer->compressor->uncompress
                    (_lineBuffer->buffer, _lineBuffer->packedDataSize,
                     _lineBuffer->minY, _lineBuffer->uncompressedData);
            }
            else
            {
                //
                // If the line is uncompressed, it's in XDR format,
                // regardless of the compressor's output format.
                //

                _lineBuffer->format = Compressor::XDR;
                _lineBuffer->uncompressedData = _lineBuffer->buffer;
            }
        }

        int yStart, yStop, dy;

        if (_ifd->lineOrder == INCREASING_Y)
        {
            yStart = _scanLineMin;
            yStop = _scanLineMax + 1;
            dy = 1;
        }
        else
        {
            yStart = _scanLineMax;
            yStop = _scanLineMin - 1;
            dy = -1;
        }

        for (int y = yStart; y != yStop; y += dy)
        {
            //
            // Convert one scan line's worth of pixel data back
            // from the machine-independent representation, and
            // store the result in the frame buffer.
            //

            const char *readPtr = _lineBuffer->uncompressedData +
                                  _ifd->offsetInLineBuffer[y - _ifd->minY];

            //
            // Iterate over all image channels.
            //

            for (unsigned int i = 0; i < _ifd->slices.size(); ++i)
            {
                //
                // Test if scan line y of this channel contains any data
                // (the scan line contains data only if y % ySampling == 0).
                //

                InSliceInfo &slice = *_ifd->slices[i];

                if (modp (y, slice.ySampling) != 0)
                    continue;

                //
                // Find the x coordinates of the leftmost and rightmost
                // sampled pixels (i.e. pixels within the data window
                // for which x % xSampling == 0).
                //

                //
                // Fill the frame buffer with pixel data.
                //

                if (slice.skip)
                {
                    //
                    // The file contains data for this channel, but
                    // the frame buffer contains no slice for this channel.
                    //

                    skipChannel (readPtr, slice.typeInFile,
                                 _ifd->lineSampleCount[y - _ifd->minY]);
                }
                else
                {
                    //
                    // The frame buffer contains a slice for this channel.
                    //

                    int width = (_ifd->maxX - _ifd->minX + 1);

                    copyIntoDeepFrameBuffer (readPtr, slice.base,
                                             (char*) (&_ifd->sampleCount[0][0]
                                                      - _ifd->minX
                                                      - _ifd->minY * width),
                                             sizeof(unsigned int) * 1,
                                             sizeof(unsigned int) * width,
                                             y, _ifd->minX, _ifd->maxX,
                                             0, 0,
                                             0, 0,
                                             slice.sampleStride, 
                                             slice.xPointerStride,
                                             slice.yPointerStride,
                                             slice.fill,
                                             slice.fillValue, _lineBuffer->format,
                                             slice.typeInFrameBuffer,
                                             slice.typeInFile);
                }
            }
        }
    }
    catch (std::exception &e)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception = e.what();
            _lineBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception = "unrecognized exception";
            _lineBuffer->hasException = true;
        }
    }
}